

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O2

void boost::asio::detail::thread_info_base::deallocate
               (thread_info_base *this_thread,void *pointer,size_t size)

{
  if ((this_thread != (thread_info_base *)0x0 && size < 0x3fd) &&
     (this_thread->reusable_memory_ == (void *)0x0)) {
    *(undefined1 *)pointer = *(undefined1 *)((long)pointer + size);
    this_thread->reusable_memory_ = pointer;
    return;
  }
  operator_delete(pointer);
  return;
}

Assistant:

static void deallocate(thread_info_base* this_thread,
      void* pointer, std::size_t size)
  {
    if (size <= chunk_size * UCHAR_MAX)
    {
      if (this_thread && this_thread->reusable_memory_ == 0)
      {
        unsigned char* const mem = static_cast<unsigned char*>(pointer);
        mem[0] = mem[size];
        this_thread->reusable_memory_ = pointer;
        return;
      }
    }

    ::operator delete(pointer);
  }